

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search_entityrelationtask.cc
# Opt level: O3

void EntityRelationTask::decode_tag(v_array<char> tag,char *type,int *id1,int *id2)

{
  char *pcVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  string s1;
  char *local_70;
  undefined8 local_68;
  char local_60 [16];
  char *local_50;
  undefined8 local_48;
  char local_40 [16];
  
  local_48 = 0;
  local_40[0] = '\0';
  local_70 = local_60;
  local_68 = 0;
  local_60[0] = '\0';
  *type = *tag._begin;
  uVar5 = (long)tag._end - (long)tag._begin;
  uVar3 = 2;
  uVar4 = uVar3;
  local_50 = local_40;
  if (2 < uVar5) {
    do {
      uVar4 = uVar3;
      if ((tag._begin[uVar3] == '\0') || (tag._begin[uVar3] == '_')) break;
      std::__cxx11::string::push_back((char)&local_50);
      uVar3 = uVar3 + 1;
      uVar4 = uVar5;
    } while (uVar5 != uVar3);
  }
  iVar2 = atoi(local_50);
  *id1 = iVar2;
  while (((pcVar1 = local_70, uVar4 = uVar4 + 1, uVar4 < uVar5 && (tag._begin[uVar4] != '\0')) &&
         (tag._begin[uVar4] != '_'))) {
    std::__cxx11::string::push_back((char)&local_70);
  }
  iVar2 = atoi(local_70);
  *id2 = iVar2;
  if (pcVar1 != local_60) {
    operator_delete(pcVar1);
  }
  if (local_50 != local_40) {
    operator_delete(local_50);
  }
  return;
}

Assistant:

void decode_tag(v_array<char> tag, char& type, int& id1, int& id2)
{
  string s1;
  string s2;
  type = tag[0];
  size_t idx = 2;
  while (idx < tag.size() && tag[idx] != '_' && tag[idx] != '\0')
  {
    s1.push_back(tag[idx]);
    idx++;
  }
  id1 = atoi(s1.c_str());
  idx++;
  assert(type == 'R');
  while (idx < tag.size() && tag[idx] != '_' && tag[idx] != '\0')
  {
    s2.push_back(tag[idx]);
    idx++;
  }
  id2 = atoi(s2.c_str());
}